

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterHyperDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  int iVar1;
  int iVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  pointer pnVar4;
  pointer pnVar5;
  int *piVar6;
  DIdxSet *this_00;
  type_conflict5 tVar7;
  DataKey DVar8;
  long lVar9;
  long lVar10;
  pointer pnVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  devexpr *pdVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  ulong uVar16;
  ulong uVar17;
  byte bVar18;
  int local_504;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4c8;
  DIdxSet *local_440;
  cpp_dec_float<200U,_int,_void> *local_438;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  devexpr local_230 [112];
  int local_1c0;
  undefined1 local_1bc;
  fpclass_type local_1b8;
  int32_t iStack_1b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  devexpr local_b0 [112];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar18 = 0;
  pSVar3 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar4 = (pSVar3->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar5 = (pSVar3->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_3b0,-1,(type *)0x0);
  local_4c8.m_backend.fpclass = cpp_dec_float_finite;
  local_4c8.m_backend.prec_elem = 0x1c;
  local_4c8.m_backend.data._M_elems[0] = 0;
  local_4c8.m_backend.data._M_elems[1] = 0;
  local_4c8.m_backend.data._M_elems[2] = 0;
  local_4c8.m_backend.data._M_elems[3] = 0;
  local_4c8.m_backend.data._M_elems[4] = 0;
  local_4c8.m_backend.data._M_elems[5] = 0;
  local_4c8.m_backend.data._M_elems[6] = 0;
  local_4c8.m_backend.data._M_elems[7] = 0;
  local_4c8.m_backend.data._M_elems[8] = 0;
  local_4c8.m_backend.data._M_elems[9] = 0;
  local_4c8.m_backend.data._M_elems[10] = 0;
  local_4c8.m_backend.data._M_elems[0xb] = 0;
  local_4c8.m_backend.data._M_elems[0xc] = 0;
  local_4c8.m_backend.data._M_elems[0xd] = 0;
  local_4c8.m_backend.data._M_elems[0xe] = 0;
  local_4c8.m_backend.data._M_elems[0xf] = 0;
  local_4c8.m_backend.data._M_elems[0x10] = 0;
  local_4c8.m_backend.data._M_elems[0x11] = 0;
  local_4c8.m_backend.data._M_elems[0x12] = 0;
  local_4c8.m_backend.data._M_elems[0x13] = 0;
  local_4c8.m_backend.data._M_elems[0x14] = 0;
  local_4c8.m_backend.data._M_elems[0x15] = 0;
  local_4c8.m_backend.data._M_elems[0x16] = 0;
  local_4c8.m_backend.data._M_elems[0x17] = 0;
  local_4c8.m_backend.data._M_elems[0x18] = 0;
  local_4c8.m_backend.data._M_elems[0x19] = 0;
  local_4c8.m_backend.data._M_elems._104_5_ = 0;
  local_4c8.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_4c8.m_backend.exp = 0;
  local_4c8.m_backend.neg = false;
  uVar17 = (ulong)(uint)(this->bestPrices).super_IdxSet.num;
  local_504 = -1;
LAB_0043c5a7:
  uVar16 = uVar17 & 0xffffffff;
  while( true ) {
    uVar17 = uVar17 - 1;
    if ((int)uVar16 < 1) {
      local_440 = &this->bestPrices;
      uVar17 = (ulong)(uint)(((this->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver)->updateViols).super_IdxSet.num;
      goto LAB_0043c8aa;
    }
    iVar1 = (this->bestPrices).super_IdxSet.idx[uVar17];
    lVar10 = 0x1c;
    pnVar11 = pnVar4 + iVar1;
    pnVar13 = &local_4c8;
    for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
      pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar18 * -2 + 1) * 4);
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    local_4c8.m_backend.exp = pnVar4[iVar1].m_backend.exp;
    local_4c8.m_backend.neg = pnVar4[iVar1].m_backend.neg;
    local_4c8.m_backend.fpclass = pnVar4[iVar1].m_backend.fpclass;
    local_4c8.m_backend.prec_elem = pnVar4[iVar1].m_backend.prec_elem;
    pnVar13 = feastol;
    pnVar15 = &result;
    for (; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar15->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    result.m_backend.exp = (feastol->m_backend).exp;
    result.m_backend.neg = (feastol->m_backend).neg;
    result.m_backend.fpclass = (feastol->m_backend).fpclass;
    result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    tVar7 = boost::multiprecision::operator<(&local_4c8,&result);
    if (tVar7) break;
    piVar6 = (this->bestPrices).super_IdxSet.idx;
    iVar2 = (this->bestPrices).super_IdxSet.num;
    (this->bestPrices).super_IdxSet.num = iVar2 + -1;
    piVar6[uVar17] = piVar6[(long)iVar2 + -1];
    (((this->
      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thesolver)->isInfeasible).data[iVar1] = 0;
    uVar16 = (ulong)((int)uVar16 - 1);
  }
  lVar10 = 0x1c;
  pnVar13 = &local_4c8;
  pdVar14 = local_b0;
  for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
    *(uint *)pdVar14 = (pnVar13->m_backend).data._M_elems[0];
    pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
    pdVar14 = pdVar14 + (ulong)bVar18 * -8 + 4;
  }
  local_40 = local_4c8.m_backend.exp;
  local_3c = local_4c8.m_backend.neg;
  local_38 = local_4c8.m_backend.fpclass;
  iStack_34 = local_4c8.m_backend.prec_elem;
  pcVar12 = &pnVar5[iVar1].m_backend;
  pnVar13 = &local_130;
  for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar13->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
    pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar18 * -8 + 4);
    pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
  }
  local_130.m_backend.exp = pnVar5[iVar1].m_backend.exp;
  local_130.m_backend.neg = pnVar5[iVar1].m_backend.neg;
  local_130.m_backend.fpclass = pnVar5[iVar1].m_backend.fpclass;
  local_130.m_backend.prec_elem = pnVar5[iVar1].m_backend.prec_elem;
  pnVar13 = feastol;
  pnVar15 = &local_1b0;
  for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar15->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
    pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
    pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
  }
  local_1b0.m_backend.exp = (feastol->m_backend).exp;
  local_1b0.m_backend.neg = (feastol->m_backend).neg;
  local_1b0.m_backend.fpclass = (feastol->m_backend).fpclass;
  local_1b0.m_backend.prec_elem = (feastol->m_backend).prec_elem;
  devexpr::
  computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (&result,local_b0,&local_130,&local_1b0,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_b0);
  pnVar13 = &result;
  pnVar15 = &local_4c8;
  for (; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pnVar15->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
    pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
    pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
  }
  local_4c8.m_backend.exp = result.m_backend.exp;
  local_4c8.m_backend.neg = result.m_backend.neg;
  local_4c8.m_backend.fpclass = result.m_backend.fpclass;
  local_4c8.m_backend.prec_elem = result.m_backend.prec_elem;
  tVar7 = boost::multiprecision::operator>(&local_4c8,best);
  if (tVar7) {
    pnVar13 = &local_4c8;
    pnVar15 = best;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar15->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    (best->m_backend).exp = local_4c8.m_backend.exp;
    (best->m_backend).neg = local_4c8.m_backend.neg;
    (best->m_backend).fpclass = local_4c8.m_backend.fpclass;
    (best->m_backend).prec_elem = local_4c8.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&(this->last).m_backend,&pnVar5[iVar1].m_backend);
    local_504 = iVar1;
  }
  tVar7 = boost::multiprecision::operator<
                    (&local_4c8,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_3b0);
  if (!tVar7) goto LAB_0043c82d;
  goto LAB_0043c855;
LAB_0043c8aa:
  uVar16 = uVar17 & 0xffffffff;
  do {
    uVar17 = uVar17 - 1;
    if ((int)uVar16 < 1) {
      if (local_504 < 0) {
        DVar8.info = 0;
        DVar8.idx = -1;
      }
      else {
        DVar8 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::coId((this->
                                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).thesolver,local_504);
      }
      return (SPxId)DVar8;
    }
    pSVar3 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    iVar1 = (pSVar3->updateViols).super_IdxSet.idx[uVar17];
    if ((pSVar3->isInfeasible).data[iVar1] == 1) {
      lVar10 = 0x1c;
      pnVar11 = pnVar4 + iVar1;
      pnVar13 = &local_4c8;
      for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar13->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (pointer)((long)pnVar11 + ((ulong)bVar18 * -2 + 1) * 4);
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      local_4c8.m_backend.exp = pnVar4[iVar1].m_backend.exp;
      local_4c8.m_backend.neg = pnVar4[iVar1].m_backend.neg;
      local_4c8.m_backend.fpclass = pnVar4[iVar1].m_backend.fpclass;
      local_4c8.m_backend.prec_elem = pnVar4[iVar1].m_backend.prec_elem;
      pnVar13 = feastol;
      pnVar15 = &result;
      for (; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar15->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
        pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      result.m_backend.exp = (feastol->m_backend).exp;
      result.m_backend.neg = (feastol->m_backend).neg;
      result.m_backend.fpclass = (feastol->m_backend).fpclass;
      result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
      if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0
         ) {
        result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
      }
      tVar7 = boost::multiprecision::operator<(&local_4c8,&result);
      if (tVar7) {
        lVar10 = 0x1c;
        pnVar13 = &local_4c8;
        pdVar14 = local_230;
        for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
          *(uint *)pdVar14 = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
          pdVar14 = pdVar14 + (ulong)bVar18 * -8 + 4;
        }
        local_1c0 = local_4c8.m_backend.exp;
        local_1bc = local_4c8.m_backend.neg;
        local_1b8 = local_4c8.m_backend.fpclass;
        iStack_1b4 = local_4c8.m_backend.prec_elem;
        local_438 = &pnVar5[iVar1].m_backend;
        pcVar12 = local_438;
        pnVar13 = &local_2b0;
        for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pnVar13->m_backend).data._M_elems[0] =
               (((cpp_dec_float<200U,_int,_void> *)&pcVar12->data)->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar18 * -8 + 4);
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
        }
        local_2b0.m_backend.exp = pnVar5[iVar1].m_backend.exp;
        local_2b0.m_backend.neg = pnVar5[iVar1].m_backend.neg;
        local_2b0.m_backend.fpclass = pnVar5[iVar1].m_backend.fpclass;
        local_2b0.m_backend.prec_elem = pnVar5[iVar1].m_backend.prec_elem;
        pnVar13 = feastol;
        pnVar15 = &local_330;
        for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pnVar15->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
          pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
        }
        local_330.m_backend.exp = (feastol->m_backend).exp;
        local_330.m_backend.neg = (feastol->m_backend).neg;
        local_330.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_330.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&result,local_230,&local_2b0,&local_330,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_230);
        pnVar13 = &result;
        pnVar15 = &local_4c8;
        for (; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar15->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
          pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
          pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
        }
        local_4c8.m_backend.exp = result.m_backend.exp;
        local_4c8.m_backend.neg = result.m_backend.neg;
        local_4c8.m_backend.fpclass = result.m_backend.fpclass;
        local_4c8.m_backend.prec_elem = result.m_backend.prec_elem;
        tVar7 = boost::multiprecision::operator>
                          (&local_4c8,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_3b0);
        pcVar12 = local_438;
        this_00 = local_440;
        if (tVar7) break;
      }
      else {
        (((this->
          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).thesolver)->isInfeasible).data[iVar1] = 0;
      }
    }
    uVar16 = (ulong)((int)uVar16 - 1);
  } while( true );
  tVar7 = boost::multiprecision::operator>(&local_4c8,best);
  if (tVar7) {
    pnVar13 = &local_4c8;
    pnVar15 = best;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar15->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    (best->m_backend).exp = local_4c8.m_backend.exp;
    (best->m_backend).neg = local_4c8.m_backend.neg;
    (best->m_backend).fpclass = local_4c8.m_backend.fpclass;
    (best->m_backend).prec_elem = local_4c8.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&(this->last).m_backend,pcVar12);
    local_504 = iVar1;
  }
  (((this->
    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).thesolver)->isInfeasible).data[iVar1] = 2;
  DIdxSet::addIdx(this_00,iVar1);
  goto LAB_0043c8aa;
LAB_0043c82d:
  result.m_backend.data._M_elems[0] = 0;
  tVar7 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_3b0,(int *)&result);
  if (tVar7) {
LAB_0043c855:
    pnVar13 = &local_4c8;
    pcVar12 = &local_3b0;
    for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
      (((cpp_dec_float<200U,_int,_void> *)&pcVar12->data)->data)._M_elems[0] =
           (pnVar13->m_backend).data._M_elems[0];
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
      pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    local_3b0.exp = local_4c8.m_backend.exp;
    local_3b0.neg = local_4c8.m_backend.neg;
    local_3b0.fpclass = local_4c8.m_backend.fpclass;
    local_3b0.prec_elem = local_4c8.m_backend.prec_elem;
  }
  goto LAB_0043c5a7;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterHyperDim(R& best, R feastol)
{
   const R* cTest = this->thesolver->coTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   R leastBest = -1;
   R x;
   int enterIdx = -1;
   int idx;

   // find the best price from short candidate list
   for(int i = bestPrices.size() - 1; i >= 0; --i)
   {
      idx = bestPrices.index(i);
      x = cTest[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, cpen[idx], feastol);

         assert(x >= 0);

         // update the best price of candidate list
         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = cpen[idx];
         }

         // update the smallest price of candidate list
         if(x < leastBest || leastBest < 0)
            leastBest = x;
      }
      else
      {
         bestPrices.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

   // scan the updated indeces for a better price
   for(int i = this->thesolver->updateViols.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->updateViols.index(i);

      // only look at indeces that were not checked already
      if(this->thesolver->isInfeasible[idx] == this->VIOLATED)
      {
         x = cTest[idx];

         if(x < -feastol)
         {
            x = devexpr::computePrice(x, cpen[idx], feastol);

            if(x > leastBest)
            {
               if(x > best)
               {
                  best = x;
                  enterIdx = idx;
                  last = cpen[idx];
               }

               // put index into candidate list
               this->thesolver->isInfeasible[idx] = this->VIOLATED_AND_CHECKED;
               bestPrices.addIdx(idx);
            }
         }
         else
         {
            this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->coId(enterIdx);
   else
      return SPxId();
}